

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic.c
# Opt level: O0

int picnic_sign(picnic_privatekey_t *sk,uint8_t *message,size_t message_len,uint8_t *signature,
               size_t *signature_len)

{
  byte bVar1;
  picnic_params_t param_00;
  picnic_instance_t *ppVar2;
  long in_RCX;
  byte *in_RDI;
  long in_R8;
  int ret;
  picnic_context_t context;
  uint8_t *sk_pt;
  uint8_t *sk_c;
  uint8_t *sk_sk;
  picnic_instance_t *instance;
  picnic_params_t param;
  size_t *in_stack_00000d20;
  uint8_t *in_stack_00000d28;
  picnic_context_t *in_stack_00000d30;
  picnic_instance_t *in_stack_00000d38;
  size_t in_stack_fffffffffffffee8;
  uint8_t *in_stack_fffffffffffffef0;
  mzd_local_t *in_stack_fffffffffffffef8;
  undefined1 auStack_100 [32];
  byte *local_e0;
  byte *local_d8;
  size_t in_stack_ffffffffffffff30;
  uint8_t *in_stack_ffffffffffffff38;
  uint8_t *in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff49;
  uint8_t *in_stack_ffffffffffffff50;
  picnic_instance_t *in_stack_ffffffffffffff58;
  uint8_t *in_stack_ffffffffffffff68;
  size_t *in_stack_ffffffffffffff70;
  int local_34;
  
  if (((in_RDI == (byte *)0x0) || (in_RCX == 0)) || (in_R8 == 0)) {
    local_34 = -1;
  }
  else {
    param_00 = (picnic_params_t)*in_RDI;
    ppVar2 = picnic_instance_get(param_00);
    if (ppVar2 == (picnic_instance_t *)0x0) {
      local_34 = -1;
    }
    else {
      bVar1 = ppVar2->input_output_size;
      if (((param_00 == Picnic3_L1) || (param_00 == Picnic3_L3)) || (param_00 == Picnic3_L5)) {
        local_34 = impl_sign_picnic3(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                     (uint8_t *)
                                     CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48),
                                     in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                                     in_stack_ffffffffffffff30,in_stack_ffffffffffffff68,
                                     in_stack_ffffffffffffff70);
      }
      else {
        mzd_from_char_array(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                            in_stack_fffffffffffffee8);
        mzd_from_char_array(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                            in_stack_fffffffffffffee8);
        local_e0 = in_RDI + (int)((uint)bVar1 * 2 + 1);
        local_d8 = in_RDI + 1;
        picnic_instance_is_unruh(param_00);
        local_34 = picnic_impl_sign(in_stack_00000d38,in_stack_00000d30,in_stack_00000d28,
                                    in_stack_00000d20);
        explicit_bzero(auStack_100,0x20);
      }
    }
  }
  return local_34;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_sign(const picnic_privatekey_t* sk, const uint8_t* message,
                                          size_t message_len, uint8_t* signature,
                                          size_t* signature_len) {
  if (!sk || !signature || !signature_len) {
    return -1;
  }

  const picnic_params_t param       = sk->data[0];
  const picnic_instance_t* instance = picnic_instance_get(param);
  if (!instance) {
    return -1;
  }

  const uint8_t* sk_sk = SK_SK(sk);
  const uint8_t* sk_c  = SK_C(sk, instance);
  const uint8_t* sk_pt = SK_PT(sk, instance);

  if (param == Picnic3_L1 || param == Picnic3_L3 || param == Picnic3_L5) {
#if defined(WITH_KKW)
    return impl_sign_picnic3(instance, sk_pt, sk_sk, sk_c, message, message_len, signature,
                             signature_len);
#else
    return -1;
#endif
  } else {
#if defined(WITH_ZKBPP)
    picnic_context_t context;
    mzd_from_char_array(context.m_plaintext, sk_pt, instance->input_output_size);
    mzd_from_char_array(context.m_key, sk_sk, instance->input_output_size);
    context.plaintext   = sk_pt;
    context.private_key = sk_sk;
    context.public_key  = sk_c;
    context.msg         = message;
    context.msglen      = message_len;
#if defined(WITH_UNRUH)
    context.unruh = picnic_instance_is_unruh(param);
#endif
    int ret = picnic_impl_sign(instance, &context, signature, signature_len);
    picnic_explicit_bzero(context.m_key, sizeof(context.m_key));
    return ret;
#else
    return -1;
#endif
  }
}